

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmartFpuControl.cpp
# Opt level: O3

void __thiscall SmartFPUControlT<true>::RestoreFPUControl(SmartFPUControlT<true> *this)

{
  if (this->m_oldFpuControl != 0xffffffff) {
    this->m_oldFpuControl = 0xffffffff;
    this->m_err = 0;
  }
  return;
}

Assistant:

void
SmartFPUControlT<enabled>::RestoreFPUControl()
{
    if (enabled)
    {
        if (m_oldFpuControl != INVALID_FPUCONTROL)
        {
            m_err = SetFPUControl(m_oldFpuControl);
            m_oldFpuControl = INVALID_FPUCONTROL; // Only restore once
        }
    }
    else
    {
        // Shouldn't restore if this is not enabled
        Assert(false);
    }
}